

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

void __thiscall
google::protobuf::SplitStringUsing
          (protobuf *this,StringPiece full,char *delim,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *result)

{
  protobuf pVar1;
  size_t sVar2;
  size_type pos;
  size_type pos_00;
  protobuf *ppVar3;
  char c;
  protobuf *ppVar4;
  protobuf *ppVar5;
  StringPiece s;
  StringPiece s_00;
  StringPiece s_01;
  string local_70;
  StringPiece local_50;
  StringPiece local_40;
  
  ppVar5 = (protobuf *)full.length_;
  local_40.length_ = (stringpiece_ssize_type)full.ptr_;
  pVar1 = *ppVar5;
  local_40.ptr_ = (char *)this;
  if ((pVar1 == (protobuf)0x0) || (ppVar5[1] != (protobuf)0x0)) {
    sVar2 = strlen((char *)ppVar5);
    s.length_ = sVar2;
    s.ptr_ = (char *)ppVar5;
    pos = StringPiece::find_first_not_of(&local_40,s,0);
    while (pos != 0xffffffffffffffff) {
      sVar2 = strlen((char *)ppVar5);
      s_00.length_ = sVar2;
      s_00.ptr_ = (char *)ppVar5;
      pos_00 = StringPiece::find_first_of(&local_40,s_00,pos);
      if (pos_00 == 0xffffffffffffffff) {
        local_50 = StringPiece::substr(&local_40,pos,0xffffffffffffffff);
        StringPiece::ToString_abi_cxx11_(&local_70,&local_50);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)delim,
                   &local_70);
        std::__cxx11::string::~string((string *)&local_70);
        return;
      }
      local_50 = StringPiece::substr(&local_40,pos,pos_00 - pos);
      StringPiece::ToString_abi_cxx11_(&local_70,&local_50);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)delim,
                 &local_70);
      std::__cxx11::string::~string((string *)&local_70);
      sVar2 = strlen((char *)ppVar5);
      s_01.length_ = sVar2;
      s_01.ptr_ = (char *)ppVar5;
      pos = StringPiece::find_first_not_of(&local_40,s_01,pos_00);
    }
  }
  else {
    ppVar5 = (protobuf *)(local_40.length_ + (long)this);
    while (this != ppVar5) {
      ppVar3 = this;
      if (*this == pVar1) {
        this = this + 1;
      }
      else {
        do {
          ppVar3 = ppVar3 + 1;
          ppVar4 = ppVar5;
          if (ppVar3 == ppVar5) break;
          ppVar4 = ppVar3;
        } while (*ppVar3 != pVar1);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,this,ppVar4);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)delim,
                   &local_70);
        std::__cxx11::string::~string((string *)&local_70);
        this = ppVar4;
      }
    }
  }
  return;
}

Assistant:

void SplitStringUsing(StringPiece full, const char *delim,
                      std::vector<std::string> *result) {
  std::back_insert_iterator<std::vector<std::string> > it(*result);
  SplitStringToIteratorUsing(full, delim, it);
}